

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O0

int TIFFStartStrip(TIFF *tif,uint32_t strip)

{
  int iVar1;
  uint64_t uVar2;
  TIFFDirectory *td;
  uint32_t strip_local;
  TIFF *tif_local;
  
  if ((tif->tif_flags & 0x20) == 0) {
    iVar1 = (*tif->tif_setupdecode)(tif);
    if (iVar1 == 0) {
      return 0;
    }
    tif->tif_flags = tif->tif_flags | 0x20;
  }
  tif->tif_curstrip = strip;
  tif->tif_row = (strip % (tif->tif_dir).td_stripsperimage) * (tif->tif_dir).td_rowsperstrip;
  tif->tif_flags = tif->tif_flags & 0xffefffff;
  if ((tif->tif_flags & 0x20000) == 0) {
    tif->tif_rawcp = tif->tif_rawdata;
    if (tif->tif_rawdataloaded < 1) {
      uVar2 = TIFFGetStrileByteCount(tif,strip);
      tif->tif_rawcc = uVar2;
    }
    else {
      tif->tif_rawcc = tif->tif_rawdataloaded;
    }
  }
  else {
    tif->tif_rawcp = (uint8_t *)0x0;
    tif->tif_rawcc = 0;
  }
  iVar1 = (*tif->tif_predecode)(tif,(uint16_t)(strip / (tif->tif_dir).td_stripsperimage));
  if (iVar1 == 0) {
    tif->tif_curstrip = 0xffffffff;
  }
  tif_local._4_4_ = (uint)(iVar1 != 0);
  return tif_local._4_4_;
}

Assistant:

static int TIFFStartStrip(TIFF *tif, uint32_t strip)
{
    TIFFDirectory *td = &tif->tif_dir;

    if ((tif->tif_flags & TIFF_CODERSETUP) == 0)
    {
        if (!(*tif->tif_setupdecode)(tif))
            return (0);
        tif->tif_flags |= TIFF_CODERSETUP;
    }
    tif->tif_curstrip = strip;
    tif->tif_row = (strip % td->td_stripsperimage) * td->td_rowsperstrip;
    tif->tif_flags &= ~TIFF_BUF4WRITE;

    if (tif->tif_flags & TIFF_NOREADRAW)
    {
        tif->tif_rawcp = NULL;
        tif->tif_rawcc = 0;
    }
    else
    {
        tif->tif_rawcp = tif->tif_rawdata;
        if (tif->tif_rawdataloaded > 0)
            tif->tif_rawcc = tif->tif_rawdataloaded;
        else
            tif->tif_rawcc = (tmsize_t)TIFFGetStrileByteCount(tif, strip);
    }
    if ((*tif->tif_predecode)(tif, (uint16_t)(strip / td->td_stripsperimage)) ==
        0)
    {
        /* Needed for example for scanline access, if tif_predecode */
        /* fails, and we try to read the same strip again. Without invalidating
         */
        /* tif_curstrip, we'd call tif_decoderow() on a possibly invalid */
        /* codec state. */
        tif->tif_curstrip = NOSTRIP;
        return 0;
    }
    return 1;
}